

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinHeap.h
# Opt level: O1

void __thiscall
sznet::MinHeap<sznet::Timer>::shiftDown_(MinHeap<sznet::Timer> *this,uint32_t hole_index,Timer *e)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar1 = hole_index * 2 + 2;
  uVar3 = this->m_size;
  if (uVar3 < uVar1) {
LAB_00112a5e:
    uVar5 = (ulong)hole_index;
  }
  else {
    uVar2 = hole_index * 2;
    do {
      uVar5 = (ulong)uVar1;
      if (uVar1 == uVar3) {
LAB_00112a88:
        uVar5 = (ulong)(uVar2 | 1);
      }
      else {
        iVar4 = (*this->m_pCmpFunc)(this->m_ptrArr[uVar5],this->m_ptrArr[(ulong)uVar2 + 1]);
        if (iVar4 == 1) goto LAB_00112a88;
      }
      uVar6 = (uint)uVar5;
      iVar4 = (*this->m_pCmpFunc)(e,this->m_ptrArr[uVar5]);
      if (iVar4 == -1) goto LAB_00112a5e;
      this->m_ptrArr[hole_index] = this->m_ptrArr[uVar5];
      (this->m_ptrArr[hole_index]->super_MinHeaBaseElem).min_heap_idx = hole_index;
      uVar2 = uVar6 * 2;
      uVar1 = uVar6 * 2 + 2;
      uVar3 = this->m_size;
      hole_index = uVar6;
    } while (uVar1 <= uVar3);
  }
  this->m_ptrArr[uVar5] = e;
  (this->m_ptrArr[uVar5]->super_MinHeaBaseElem).min_heap_idx = (int32_t)uVar5;
  return;
}

Assistant:

void shiftDown_(uint32_t hole_index, T* e)
	{
		// 用于记录值较小的子结点的下标
		uint32_t min_child_index = rightChild(hole_index);
		// min_child_index小于m_size的情况说明有左孩子也有右孩子
		// min_child_index等于m_size的情况说明只有左孩子没有右孩子
		// min_child_index大于m_size的情况说明没有左孩子也没有右孩子
		while (min_child_index <= m_size)
		{
			// 没有右孩子 或者 左孩子小于右孩子
			if (min_child_index == m_size || m_pCmpFunc(m_ptrArr[min_child_index], m_ptrArr[min_child_index - 1]) == 1)
			{
				--min_child_index;
			}
			// 如果待放入的节点e比删除节点的左右孩子中较小的还小，符合性质，结束
			if (m_pCmpFunc(e, m_ptrArr[min_child_index]) == -1)
			{
				break;
			}
			// 继续向下找合适的位置
			m_ptrArr[hole_index] = m_ptrArr[min_child_index];
			m_ptrArr[hole_index]->min_heap_idx = hole_index;
			hole_index = min_child_index;
			min_child_index = rightChild(hole_index);
		}
		// 合适位置
		m_ptrArr[hole_index] = e;
		m_ptrArr[hole_index]->min_heap_idx = hole_index;
	}